

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridFourier.cpp
# Opt level: O3

void __thiscall TasGrid::GridFourier::differentiate(GridFourier *this,double *x,double *jacobian)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  pointer piVar6;
  ulong uVar7;
  double *pdVar8;
  size_type sVar9;
  vector<double,_std::allocator<double>_> wimag;
  vector<double,_std::allocator<double>_> wreal;
  allocator_type local_81;
  size_type local_80;
  vector<double,_std::allocator<double>_> local_78;
  vector<double,_std::allocator<double>_> local_60;
  pointer local_48;
  double *local_40;
  long local_38;
  
  local_80 = (size_type)(this->super_BaseCanonicalGrid).points.cache_num_indexes;
  uVar4 = (this->super_BaseCanonicalGrid).num_dimensions *
          (this->super_BaseCanonicalGrid).num_outputs;
  if (0 < (int)uVar4) {
    memset(jacobian,0,(ulong)uVar4 << 3);
  }
  sVar9 = local_80;
  ::std::vector<double,_std::allocator<double>_>::vector
            (&local_60,local_80,(allocator_type *)&local_78);
  ::std::vector<double,_std::allocator<double>_>::vector(&local_78,sVar9,&local_81);
  local_40 = jacobian;
  computeBasis<double,false>
            (this,&(this->super_BaseCanonicalGrid).points,x,
             local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start,
             local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start);
  if (0 < (int)local_80) {
    sVar2 = (this->super_BaseCanonicalGrid).points.num_dimensions;
    piVar6 = (this->super_BaseCanonicalGrid).points.indexes.
             super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start;
    sVar3 = (this->fourier_coefs).stride;
    local_48 = (this->fourier_coefs).vec.super__Vector_base<double,_std::allocator<double>_>._M_impl
               .super__Vector_impl_data._M_start;
    uVar4 = (this->super_BaseCanonicalGrid).num_dimensions;
    uVar1 = (this->super_BaseCanonicalGrid).num_outputs;
    local_38 = sVar2 * 4;
    sVar9 = 0;
    do {
      if (0 < (int)uVar1) {
        uVar7 = 0;
        pdVar8 = local_40;
        do {
          if (0 < (int)uVar4) {
            uVar5 = 0;
            do {
              pdVar8[uVar5] =
                   (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[sVar9] * local_48[sVar3 * sVar9 + uVar7] +
                   local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start[sVar9] *
                   local_48[(sVar9 + local_80) * sVar3 + uVar7]) *
                   (double)(int)(-(piVar6[uVar5] & 1U) ^ piVar6[uVar5]) * -3.141592653589793 +
                   pdVar8[uVar5];
              uVar5 = uVar5 + 1;
            } while (uVar4 != uVar5);
          }
          uVar7 = uVar7 + 1;
          pdVar8 = pdVar8 + uVar4;
        } while (uVar7 != uVar1);
      }
      sVar9 = sVar9 + 1;
      piVar6 = piVar6 + sVar2;
    } while (sVar9 != local_80);
  }
  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (double *)0x0) {
    operator_delete(local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_60.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void GridFourier::differentiate(const double x[], double jacobian[]) const {
    /* From GridFourier::evaluate(), the contribution of a particular point/tensor to the surrogate model at a point x is
     *
     *     p(x) := Re[w] * Re[exp(c*x*I)] - Im[w] * Im[exp(c*x*I)],
     *
     * where w is a complex scalar, c is a real scalar, and I^2 = -1. Hence, the derivative is
     *
     *     p'(x) := -c * ( Re[w] * Im[exp(c*x*I)] + Im[w] * Re[exp(c*x*I)] ).
     */
    int num_points = points.getNumIndexes();
    std::fill_n(jacobian, num_outputs * num_dimensions, 0.0);
    std::vector<double> wreal(num_points), wimag(num_points);
    computeBasis<double, false>(points, x, wreal.data(), wimag.data());
    for(int i=0; i<num_points; i++) {
        const int *p = points.getIndex(i);
        const double *fcreal = fourier_coefs.getStrip(i);
        const double *fcimag = fourier_coefs.getStrip(i + num_points);
        for(int k=0; k<num_outputs; k++) {
            for(int j=0; j<num_dimensions; j++) {
                double phase = Maths::pi * (double) (p[j] % 2 == 0 ? p[j] : -p[j]-1);
                jacobian[k * num_dimensions + j] += -phase * (wimag[i] * fcreal[k] + wreal[i] * fcimag[k]);
            }
        }
    }
}